

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::FileGenerator::IsDepWeak(FileGenerator *this,FileDescriptor *dep)

{
  size_t sVar1;
  FileDescriptor *local_20;
  LogMessageFatal local_18;
  
  local_20 = dep;
  sVar1 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::count<google::protobuf::FileDescriptor_const*>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this,&local_20);
  if ((sVar1 != 0) && ((this->options_).opensource_runtime == true)) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/file.h"
               ,0xa9,"!options_.opensource_runtime");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
  }
  return sVar1 != 0;
}

Assistant:

bool IsDepWeak(const FileDescriptor* dep) const {
    if (weak_deps_.count(dep) != 0) {
      ABSL_CHECK(!options_.opensource_runtime);
      return true;
    }
    return false;
  }